

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O1

void __thiscall DrawerCommandQueue::DrawerCommandQueue(DrawerCommandQueue *this)

{
  (this->start_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->start_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->start_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->start_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->start_mutex).super___mutex_base._M_mutex.__align = 0;
  (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<DrawerThread,_std::allocator<DrawerThread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->memorypool_pos = 0;
  (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::condition_variable::condition_variable(&this->start_condition);
  *(undefined8 *)
   ((long)&(this->active_commands).
           super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->active_commands).
           super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->active_commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&this->run_id = 0;
  *(undefined8 *)((long)&(this->end_mutex).super___mutex_base._M_mutex + 4) = 0;
  *(undefined8 *)((long)&(this->end_mutex).super___mutex_base._M_mutex + 0xc) = 0;
  *(undefined8 *)((long)&(this->end_mutex).super___mutex_base._M_mutex + 0x14) = 0;
  (this->end_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->end_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->end_condition);
  this->finished_threads = 0;
  (this->thread_error).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->thread_error_fatal = false;
  *(undefined8 *)&this->threaded_render = 0;
  *(undefined8 *)((long)&(this->single_core_thread).thread._M_id._M_thread + 4) = 0;
  (this->single_core_thread).num_cores = 1;
  (this->single_core_thread).pass_start_y = 0;
  (this->single_core_thread).pass_end_y = 0xe10;
  (this->single_core_thread).dc_temp = (this->single_core_thread).dc_temp_buff;
  (this->single_core_thread).dc_temp_rgba = (this->single_core_thread).dc_temp_rgbabuff_rgba;
  this->num_passes = 1;
  this->rows_in_pass = 0xe10;
  return;
}

Assistant:

DrawerCommandQueue::DrawerCommandQueue()
{
}